

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

void chapter2::display_elem(vector<int,_std::allocator<int>_> *ivec,string *title,ostream *os)

{
  pointer piVar1;
  ostream *poVar2;
  int ix;
  ulong uVar3;
  
  poVar2 = std::operator<<(os,(string *)title);
  std::operator<<(poVar2,'\n');
  for (uVar3 = 0;
      piVar1 = (ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
      uVar3 < (ulong)((long)(ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,piVar1[uVar3]);
    std::operator<<(poVar2,' ');
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void display_elem(vector<int> &ivec, const string &title, ostream &os) {
        os << title << '\n';
        for (int ix = 0; ix < ivec.size(); ++ix) {
            os << ivec[ix] << ' ';
        }

        os << endl;
    }